

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DatatypeValidator::getCanonicalRepresentation
          (DatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  XMLCh *pXVar1;
  undefined7 in_register_00000009;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_XSerializable)._vptr_XSerializable[8])(this,rawData,0,memMgr);
  }
  pXVar1 = XMLString::replicate(rawData,memMgr);
  return pXVar1;
}

Assistant:

const XMLCh* DatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                          ,      MemoryManager* const memMgr
                                                          ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;

    if (toValidate)
    {
        DatatypeValidator *temp = (DatatypeValidator*) this;

        try
        {
            temp->validate(rawData, 0, toUse);    
        }
        catch (...)
        {
            return 0;
        }
    }

    return XMLString::replicate(rawData, toUse);
}